

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O3

vector<glu::DataType,_std::allocator<glu::DataType>_> * __thiscall
deqp::gles2::Functional::anon_unknown_1::UniformCollection::getSamplerTypes
          (vector<glu::DataType,_std::allocator<glu::DataType>_> *__return_storage_ptr__,
          UniformCollection *this)

{
  uint uVar1;
  vector<glu::DataType,_std::allocator<glu::DataType>_> *pvVar2;
  pointer pUVar3;
  long lVar4;
  long lVar5;
  
  (__return_storage_ptr__->super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pUVar3 = (this->m_uniforms).
           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar1 = (int)((ulong)((long)(this->m_uniforms).
                              super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar3) >> 3) *
          -0x49249249;
  pvVar2 = (vector<glu::DataType,_std::allocator<glu::DataType>_> *)(ulong)uVar1;
  if (0 < (int)uVar1) {
    lVar5 = 0x20;
    lVar4 = 0;
    do {
      getDistinctSamplerTypes
                (__return_storage_ptr__,(VarType *)((long)&(pUVar3->name)._M_dataplus + lVar5));
      lVar4 = lVar4 + 1;
      pUVar3 = (this->m_uniforms).
               super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar2 = (vector<glu::DataType,_std::allocator<glu::DataType>_> *)
               (long)((int)((ulong)((long)(this->m_uniforms).
                                          super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar3)
                           >> 3) * -0x49249249);
      lVar5 = lVar5 + 0x38;
    } while (lVar4 < (long)pvVar2);
  }
  return pvVar2;
}

Assistant:

vector<glu::DataType> getSamplerTypes (void) const
	{
		vector<glu::DataType> samplerTypes;
		for (int i = 0; i < (int)m_uniforms.size(); i++)
			getDistinctSamplerTypes(samplerTypes, m_uniforms[i].type);
		return samplerTypes;
	}